

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenPoseVideo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  int *piVar7;
  size_type __n;
  uchar *puVar8;
  _InputArray *p_Var9;
  reference this;
  double dVar10;
  double dVar11;
  double dVar12;
  _InputArray local_6b0;
  _InputArray local_698;
  allocator<char> local_679;
  string local_678 [32];
  Scalar_<double> local_658;
  Point_<int> local_638;
  string local_630 [32];
  _InputOutputArray local_610;
  Scalar_<double> local_5f8;
  Point_ local_5d8 [8];
  _InputOutputArray local_5d0;
  Scalar_<double> local_5b8;
  Point_ local_598 [8];
  _InputOutputArray local_590;
  Scalar_<double> local_578;
  Point_ local_558 [8];
  Point_ local_550 [8];
  _InputOutputArray local_548;
  float local_530;
  float local_52c;
  Point2f partB;
  Point2f partA;
  int n_1;
  int nPairs;
  Scalar_<double> local_510;
  Point_<int> local_4f0;
  string local_4e8 [32];
  _InputOutputArray local_4c8;
  Scalar_<double> local_4b0;
  Point_<int> local_490;
  _InputOutputArray local_488;
  Point_<float> local_470;
  _InputArray local_468;
  double local_450;
  double prob;
  Point maxLoc;
  Point2f p;
  Mat probMap;
  uint local_3d8;
  allocator<cv::Point_<int>_> local_3d1;
  int n;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> points;
  int W;
  int H;
  string local_390 [8];
  Mat output;
  MatSize local_350 [32];
  Scalar_<double> local_330;
  allocator<char> local_309;
  string local_308 [32];
  _InputArray local_2e8;
  Scalar_<double> local_2d0;
  Size_<int> local_2b0;
  _InputArray local_2a8;
  undefined1 local_290 [8];
  Mat inpBlob;
  Mat local_230 [96];
  double local_1d0;
  double t_1;
  double t;
  Net net;
  Size_<int> local_1ac;
  allocator<char> local_1a1;
  string local_1a0 [32];
  undefined1 local_180 [8];
  VideoWriter video;
  int frameHeight;
  int frameWidth;
  Mat frameCopy;
  Mat local_f0 [8];
  Mat frame;
  VideoCapture local_88 [8];
  VideoCapture cap;
  float thresh;
  int inHeight;
  int inWidth;
  allocator<char> local_39;
  string local_38 [8];
  string videoFile;
  char **argv_local;
  int argc_local;
  
  videoFile.field_2._8_8_ = argv;
  poVar5 = std::operator<<((ostream *)&std::cout,"USAGE : ./openpose <VideoFile> ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"sample_video.mp4",&local_39);
  std::allocator<char>::~allocator(&local_39);
  if (argc == 2) {
    std::__cxx11::string::operator=(local_38,*(char **)(videoFile.field_2._8_8_ + 8));
  }
  cv::VideoCapture::VideoCapture(local_88,local_38,0);
  bVar2 = cv::VideoCapture::isOpened();
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Unable to connect to camera");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    cv::Mat::Mat(local_f0);
    cv::Mat::Mat((Mat *)&frameHeight);
    dVar10 = (double)cv::VideoCapture::get((int)local_88);
    dVar11 = (double)cv::VideoCapture::get((int)local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1a0,"Output-Skeleton.avi",&local_1a1);
    uVar3 = cv::VideoWriter::fourcc('M','J','P','G');
    cv::Size_<int>::Size_(&local_1ac,(int)dVar10,(int)dVar11);
    cv::VideoWriter::VideoWriter
              ((VideoWriter *)0x4024000000000000,local_180,local_1a0,uVar3,&local_1ac,1);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    cv::dnn::dnn4_v20211004::readNetFromCaffe((string *)&t,(string *)&protoFile_abi_cxx11_);
    t_1 = 0.0;
    while (iVar4 = cv::waitKey(1), iVar4 < 0) {
      lVar6 = cv::getTickCount();
      local_1d0 = (double)lVar6;
      cv::VideoCapture::operator>>(local_88,local_f0);
      cv::Mat::clone();
      cv::Mat::operator=((Mat *)&frameHeight,local_230);
      cv::Mat::~Mat(local_230);
      cv::_InputArray::_InputArray(&local_2a8,local_f0);
      cv::Size_<int>::Size_(&local_2b0,0x170,0x170);
      cv::Scalar_<double>::Scalar_(&local_2d0,0.0,0.0,0.0,0.0);
      cv::dnn::dnn4_v20211004::blobFromImage
                ((_InputArray *)local_290,0.00392156862745098,(Size_ *)&local_2a8,
                 (Scalar_ *)&local_2b0,SUB81(&local_2d0,0),false,0);
      cv::_InputArray::~_InputArray(&local_2a8);
      cv::_InputArray::_InputArray(&local_2e8,(Mat *)local_290);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_308,"",&local_309);
      cv::Scalar_<double>::Scalar_(&local_330);
      cv::dnn::dnn4_v20211004::Net::setInput
                ((_InputArray *)&t,(string *)&local_2e8,1.0,(Scalar_ *)local_308);
      std::__cxx11::string::~string(local_308);
      std::allocator<char>::~allocator(&local_309);
      cv::_InputArray::~_InputArray(&local_2e8);
      std::__cxx11::string::string((string *)&W);
      cv::dnn::dnn4_v20211004::Net::forward(local_390);
      std::__cxx11::string::~string((string *)&W);
      piVar7 = cv::MatSize::operator[](local_350,2);
      points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = *piVar7;
      piVar7 = cv::MatSize::operator[](local_350,3);
      points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = *piVar7;
      __n = (size_type)nPoints;
      std::allocator<cv::Point_<int>_>::allocator(&local_3d1);
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&n,__n,&local_3d1);
      std::allocator<cv::Point_<int>_>::~allocator(&local_3d1);
      for (local_3d8 = 0;
          iVar1 = points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
          iVar4 = (int)points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage, (int)local_3d8 < nPoints;
          local_3d8 = local_3d8 + 1) {
        puVar8 = cv::Mat::ptr((Mat *)local_390,0,local_3d8);
        cv::Mat::Mat((Mat *)&p,iVar1,iVar4,5,puVar8,0);
        cv::Point_<float>::Point_((Point_<float> *)&maxLoc,-1.0,-1.0);
        cv::Point_<int>::Point_((Point_<int> *)&prob);
        cv::_InputArray::_InputArray(&local_468,(Mat *)&p);
        p_Var9 = (_InputArray *)cv::noArray();
        cv::minMaxLoc(&local_468,(double *)0x0,&local_450,(Point_ *)0x0,(Point_ *)&prob,p_Var9);
        cv::_InputArray::~_InputArray(&local_468);
        if (0.009999999776482582 < local_450) {
          cv::Point_::operator_cast_to_Point_((Point_ *)&local_470);
          cv::Point_<float>::operator=((Point_<float> *)&maxLoc,&local_470);
          maxLoc.x = (int)((float)maxLoc.x *
                          ((float)(int)dVar10 /
                          (float)(int)points.
                                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage));
          maxLoc.y = (int)((float)maxLoc.y *
                          ((float)(int)dVar11 /
                          (float)points.
                                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
          cv::_InputOutputArray::_InputOutputArray(&local_488,(Mat *)&frameHeight);
          cv::Point_<int>::Point_(&local_490,(int)(float)maxLoc.x,(int)(float)maxLoc.y);
          cv::Scalar_<double>::Scalar_(&local_4b0,0.0,255.0,255.0,0.0);
          cv::circle(&local_488,&local_490,8,&local_4b0,0xffffffff,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_488);
          cv::_InputOutputArray::_InputOutputArray(&local_4c8,(Mat *)&frameHeight);
          cv::format_abi_cxx11_((char *)local_4e8,"%d",(ulong)local_3d8);
          cv::Point_<int>::Point_(&local_4f0,(int)(float)maxLoc.x,(int)(float)maxLoc.y);
          cv::Scalar_<double>::Scalar_(&local_510,0.0,0.0,255.0,0.0);
          cv::putText(0x3ff199999999999a,&local_4c8,local_4e8,&local_4f0,3,&local_510,2,8,0);
          std::__cxx11::string::~string(local_4e8);
          cv::_InputOutputArray::~_InputOutputArray(&local_4c8);
        }
        cv::Point_::operator_cast_to_Point_((Point_ *)&n_1);
        this = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                         ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&n,
                          (long)(int)local_3d8);
        cv::Point_<int>::operator=(this,(Point_<int> *)&n_1);
        cv::Mat::~Mat((Mat *)&p);
      }
      for (partA.x = 0.0; (int)partA.x < 0xe; partA.x = (float)((int)partA.x + 1)) {
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&n,
                   (long)POSE_PAIRS[(int)partA.x][0]);
        cv::Point_::operator_cast_to_Point_((Point_ *)&partB);
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&n,
                   (long)POSE_PAIRS[(int)partA.x][1]);
        cv::Point_::operator_cast_to_Point_((Point_ *)&local_530);
        if ((((0.0 < partB.x) && (0.0 < partB.y)) && (0.0 < local_530)) && (0.0 < local_52c)) {
          cv::_InputOutputArray::_InputOutputArray(&local_548,local_f0);
          cv::Point_::operator_cast_to_Point_(local_550);
          cv::Point_::operator_cast_to_Point_(local_558);
          cv::Scalar_<double>::Scalar_(&local_578,0.0,255.0,255.0,0.0);
          cv::line(&local_548,local_550,local_558,&local_578,8,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_548);
          cv::_InputOutputArray::_InputOutputArray(&local_590,local_f0);
          cv::Point_::operator_cast_to_Point_(local_598);
          cv::Scalar_<double>::Scalar_(&local_5b8,0.0,0.0,255.0,0.0);
          cv::circle(&local_590,local_598,8,&local_5b8,0xffffffff,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_590);
          cv::_InputOutputArray::_InputOutputArray(&local_5d0,local_f0);
          cv::Point_::operator_cast_to_Point_(local_5d8);
          cv::Scalar_<double>::Scalar_(&local_5f8,0.0,0.0,255.0,0.0);
          cv::circle(&local_5d0,local_5d8,8,&local_5f8,0xffffffff,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_5d0);
        }
      }
      lVar6 = cv::getTickCount();
      dVar12 = (double)lVar6 - local_1d0;
      local_1d0 = (double)cv::getTickFrequency();
      local_1d0 = dVar12 / local_1d0;
      cv::_InputOutputArray::_InputOutputArray(&local_610,local_f0);
      cv::format_abi_cxx11_((char *)local_630,local_1d0,"time taken = %.2f sec");
      cv::Point_<int>::Point_(&local_638,0x32,0x32);
      cv::Scalar_<double>::Scalar_(&local_658,255.0,50.0,0.0,0.0);
      cv::putText(0x3fe999999999999a,&local_610,local_630,&local_638,3,&local_658,2,8,0);
      std::__cxx11::string::~string(local_630);
      cv::_InputOutputArray::~_InputOutputArray(&local_610);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_678,"Output-Skeleton",&local_679);
      cv::_InputArray::_InputArray(&local_698,local_f0);
      cv::imshow(local_678,&local_698);
      cv::_InputArray::~_InputArray(&local_698);
      std::__cxx11::string::~string(local_678);
      std::allocator<char>::~allocator(&local_679);
      cv::_InputArray::_InputArray(&local_6b0,local_f0);
      cv::VideoWriter::write((_InputArray *)local_180);
      cv::_InputArray::~_InputArray(&local_6b0);
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&n);
      cv::Mat::~Mat((Mat *)local_390);
      cv::Mat::~Mat((Mat *)local_290);
    }
    cv::VideoCapture::release();
    cv::VideoWriter::release();
    argv_local._4_4_ = 0;
    cv::dnn::dnn4_v20211004::Net::~Net((Net *)&t);
    cv::VideoWriter::~VideoWriter((VideoWriter *)local_180);
    cv::Mat::~Mat((Mat *)&frameHeight);
    cv::Mat::~Mat(local_f0);
  }
  cv::VideoCapture::~VideoCapture(local_88);
  std::__cxx11::string::~string(local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{

    cout << "USAGE : ./openpose <VideoFile> " << endl;
    
    string videoFile = "sample_video.mp4";
    // Take arguments from commmand line
    if (argc == 2)
    {   
      videoFile = argv[1];
    }

    int inWidth = 368;
    int inHeight = 368;
    float thresh = 0.01;    

    cv::VideoCapture cap(videoFile);

    if (!cap.isOpened())
    {
        cerr << "Unable to connect to camera" << endl;
        return 1;
    }
    
    Mat frame, frameCopy;
    int frameWidth = cap.get(CAP_PROP_FRAME_WIDTH);
    int frameHeight = cap.get(CAP_PROP_FRAME_HEIGHT);
    
    VideoWriter video("Output-Skeleton.avi",VideoWriter::fourcc('M','J','P','G'), 10, Size(frameWidth,frameHeight));

    Net net = readNetFromCaffe(protoFile, weightsFile);
    double t=0;
    while( waitKey(1) < 0)
    {       
        double t = (double) cv::getTickCount();

        cap >> frame;
        frameCopy = frame.clone();
        Mat inpBlob = blobFromImage(frame, 1.0 / 255, Size(inWidth, inHeight), Scalar(0, 0, 0), false, false);

        net.setInput(inpBlob);

        Mat output = net.forward();

        int H = output.size[2];
        int W = output.size[3];

        // find the position of the body parts
        vector<Point> points(nPoints);
        for (int n=0; n < nPoints; n++)
        {
            // Probability map of corresponding body's part.
            Mat probMap(H, W, CV_32F, output.ptr(0,n));

            Point2f p(-1,-1);
            Point maxLoc;
            double prob;
            minMaxLoc(probMap, 0, &prob, 0, &maxLoc);
            if (prob > thresh)
            {
                p = maxLoc;
                p.x *= (float)frameWidth / W ;
                p.y *= (float)frameHeight / H ;

                circle(frameCopy, cv::Point((int)p.x, (int)p.y), 8, Scalar(0,255,255), -1);
                cv::putText(frameCopy, cv::format("%d", n), cv::Point((int)p.x, (int)p.y), cv::FONT_HERSHEY_COMPLEX, 1.1, cv::Scalar(0, 0, 255), 2);
            }
            points[n] = p;
        }

        int nPairs = sizeof(POSE_PAIRS)/sizeof(POSE_PAIRS[0]);

        for (int n = 0; n < nPairs; n++)
        {
            // lookup 2 connected body/hand parts
            Point2f partA = points[POSE_PAIRS[n][0]];
            Point2f partB = points[POSE_PAIRS[n][1]];

            if (partA.x<=0 || partA.y<=0 || partB.x<=0 || partB.y<=0)
                continue;

            line(frame, partA, partB, Scalar(0,255,255), 8);
            circle(frame, partA, 8, Scalar(0,0,255), -1);
            circle(frame, partB, 8, Scalar(0,0,255), -1);
        }

        t = ((double)cv::getTickCount() - t)/cv::getTickFrequency();
        cv::putText(frame, cv::format("time taken = %.2f sec", t), cv::Point(50, 50), cv::FONT_HERSHEY_COMPLEX, .8, cv::Scalar(255, 50, 0), 2);
        // imshow("Output-Keypoints", frameCopy);
        imshow("Output-Skeleton", frame);
        video.write(frame);
    }
    // When everything done, release the video capture and write object
    cap.release();
    video.release();

    return 0;
}